

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetAndClearException(JsValueRef *exception)

{
  code *pcVar1;
  bool bVar2;
  JsrtContext *this;
  ScriptContext *this_00;
  undefined4 *puVar3;
  Recycler *pRVar4;
  ThreadContext *pTVar5;
  Var pvVar6;
  undefined1 local_60 [8];
  TTDJsRTActionResultAutoRecorder _actionEntryPopper;
  OutOfMemoryException anon_var_0;
  AutoHandledExceptionType local_39;
  JavascriptExceptionObject *pJStack_38;
  AutoHandledExceptionType __autoHandledExceptionType;
  JavascriptExceptionObject *recordedException;
  HRESULT hr;
  ScriptContext *scriptContext;
  JsrtContext *currentContext;
  JsValueRef *exception_local;
  
  if (exception == (JsValueRef *)0x0) {
    exception_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *exception = (JsValueRef)0x0;
    this = JsrtContext::GetCurrent();
    if (this == (JsrtContext *)0x0) {
      exception_local._4_4_ = JsErrorNoCurrentContext;
    }
    else {
      this_00 = JsrtContext::GetScriptContext(this);
      if (this_00 == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xc69,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pRVar4 = Js::ScriptContext::GetRecycler(this_00);
      if (pRVar4 != (Recycler *)0x0) {
        pRVar4 = Js::ScriptContext::GetRecycler(this_00);
        bVar2 = Memory::Recycler::IsHeapEnumInProgress(pRVar4);
        if (bVar2) {
          return JsErrorHeapEnumInProgress;
        }
      }
      pTVar5 = Js::ScriptContext::GetThreadContext(this_00);
      bVar2 = ThreadContext::IsInThreadServiceCallback(pTVar5);
      if (bVar2) {
        exception_local._4_4_ = JsErrorInThreadServiceCallback;
      }
      else {
        pTVar5 = Js::ScriptContext::GetThreadContext(this_00);
        bVar2 = ThreadContext::IsExecutionDisabled(pTVar5);
        if (bVar2) {
          exception_local._4_4_ = JsErrorInDisabledState;
        }
        else {
          pJStack_38 = (JavascriptExceptionObject *)0x0;
          AutoHandledExceptionType::AutoHandledExceptionType(&local_39,ExceptionType_OutOfMemory);
          bVar2 = Js::ScriptContext::HasRecordedException(this_00);
          if (bVar2) {
            pJStack_38 = Js::ScriptContext::GetAndClearRecordedException(this_00,(bool *)0x0);
          }
          AutoHandledExceptionType::~AutoHandledExceptionType(&local_39);
          if (pJStack_38 == (JavascriptExceptionObject *)0x0) {
            exception_local._4_4_ = JsErrorInvalidArgument;
          }
          else {
            pvVar6 = Js::JavascriptExceptionObject::GetThrownObject(pJStack_38,(ScriptContext *)0x0)
            ;
            *exception = pvVar6;
            TTD::TTDJsRTActionResultAutoRecorder::TTDJsRTActionResultAutoRecorder
                      ((TTDJsRTActionResultAutoRecorder *)local_60);
            bVar2 = Js::ScriptContext::ShouldPerformRecordAction(this_00);
            if (bVar2) {
              pTVar5 = Js::ScriptContext::GetThreadContext(this_00);
              TTD::EventLog::RecordJsRTGetAndClearException
                        (pTVar5->TTDLog,(TTDJsRTActionResultAutoRecorder *)local_60);
            }
            bVar2 = Js::ScriptContext::ShouldPerformRecordAction(this_00);
            if (bVar2) {
              TTD::TTDJsRTActionResultAutoRecorder::SetResult
                        ((TTDJsRTActionResultAutoRecorder *)local_60,exception);
            }
            if (*exception == (JsValueRef)0x0) {
              exception_local._4_4_ = JsErrorInvalidArgument;
            }
            else {
              exception_local._4_4_ = JsNoError;
            }
          }
        }
      }
    }
  }
  return exception_local._4_4_;
}

Assistant:

CHAKRA_API JsGetAndClearException(_Out_ JsValueRef *exception)
{
    PARAM_NOT_NULL(exception);
    *exception = nullptr;

    JsrtContext *currentContext = JsrtContext::GetCurrent();

    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
    Assert(scriptContext != nullptr);

    if (scriptContext->GetRecycler() && scriptContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (scriptContext->GetThreadContext()->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    if (scriptContext->GetThreadContext()->IsExecutionDisabled())
    {
        return JsErrorInDisabledState;
    }

    HRESULT hr = S_OK;
    Js::JavascriptExceptionObject *recordedException = nullptr;

    BEGIN_TRANSLATE_OOM_TO_HRESULT
      if (scriptContext->HasRecordedException())
      {
          recordedException = scriptContext->GetAndClearRecordedException();
      }
    END_TRANSLATE_OOM_TO_HRESULT(hr)

    if (hr == E_OUTOFMEMORY)
    {
        recordedException = scriptContext->GetThreadContext()->GetRecordedException();
    }
    if (recordedException == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    *exception = recordedException->GetThrownObject(nullptr);

#if ENABLE_TTD
    if(hr != E_OUTOFMEMORY)
    {
        TTD::TTDJsRTActionResultAutoRecorder _actionEntryPopper;

        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetAndClearException);
        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, exception);
    }
#endif

    if (*exception == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    return JsNoError;
}